

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O0

void __thiscall OpenGliderConnection::Stop(OpenGliderConnection *this,bool bWaitJoin)

{
  byte bVar1;
  bool bVar2;
  ssize_t sVar3;
  ulong uVar4;
  byte in_SIL;
  long in_RDI;
  LTChannel *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff0;
  long lVar5;
  undefined1 bWaitJoin_00;
  
  bVar1 = in_SIL & 1;
  lVar5 = in_RDI;
  bVar2 = LTChannel::isRunning((LTChannel *)0x20ae00);
  bWaitJoin_00 = (undefined1)((ulong)lVar5 >> 0x38);
  if (bVar2) {
    if (*(int *)(in_RDI + 0x88) < 3) {
      *(undefined4 *)(in_RDI + 0x88) = 3;
    }
    if ((*(int *)(in_RDI + 0x294) == -1) ||
       (sVar3 = write(*(int *)(in_RDI + 0x294),"STOP",4), sVar3 < 0)) {
      XPMP2::TCPConnection::Close((TCPConnection *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
    }
  }
  LTChannel::Stop(unaff_retaddr,(bool)bWaitJoin_00);
  uVar4 = std::ifstream::is_open();
  if ((uVar4 & 1) != 0) {
    std::ifstream::close();
  }
  *(undefined1 *)(in_RDI + 0x2c0) = 0;
  return;
}

Assistant:

void OpenGliderConnection::Stop (bool bWaitJoin)
{
    if (isRunning()) {
        if (eThrStatus < THR_STOP)
            eThrStatus = THR_STOP;          // indicate to the thread that it has to end itself
        
#if APL == 1 || LIN == 1
        // Mac/Lin: Try writing something to the self-pipe to stop gracefully
        if (aprsPipe[1] == INVALID_SOCKET ||
            write(aprsPipe[1], "STOP", 4) < 0)
        {
            // if the self-pipe didn't work:
#endif
            // close all connections, this will also break out of all
            // blocking calls for receiving message and hence terminate the threads
            tcpAprs.Close();
#if APL == 1 || LIN == 1
        }
#endif
    }
    
    // standard Closing
    LTFlightDataChannel::Stop(bWaitJoin);
    
    // Close a/c list
    if (ifAcList.is_open())
        ifAcList.close();
    bFailoverToHttp = false;
}